

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PMP_Multilinear.h
# Opt level: O0

void __thiscall PMP_Multilinear_Hasher::~PMP_Multilinear_Hasher(PMP_Multilinear_Hasher *this)

{
  PMP_Multilinear_Hasher *in_RDI;
  
  ~PMP_Multilinear_Hasher(in_RDI);
  operator_delete(in_RDI,0x18);
  return;
}

Assistant:

virtual ~PMP_Multilinear_Hasher()
  {
#ifdef PMPML_USE_SSE
    if ( base_addr != NULL )
        delete [] base_addr;
#else
    if ( curr_rd != NULL && curr_rd != rd_for_MPSHF )
        delete [] curr_rd;
#endif
  }